

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

_Bool hydro_equal(void *b1_,void *b2_,size_t len)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  size_t sVar4;
  uint8_t *b1;
  
  bVar3 = -(b1_ == b2_);
  if (len != 0) {
    sVar4 = 0;
    do {
      pbVar1 = (byte *)((long)b1_ + sVar4);
      pbVar2 = (byte *)((long)b2_ + sVar4);
      sVar4 = sVar4 + 1;
      bVar3 = bVar3 | *pbVar1 ^ *pbVar2;
    } while (len != sVar4);
  }
  return (_Bool)((byte)(bVar3 - 1 >> 8) & 1);
}

Assistant:

bool
hydro_equal(const void *b1_, const void *b2_, size_t len)
{
    const volatile uint8_t *volatile b1 = (const volatile uint8_t *volatile) b1_;
    const uint8_t *b2                   = (const uint8_t *) b2_;
    size_t         i;
    uint8_t        d = (uint8_t) 0U;

    if (b1 == b2) {
        d = ~d;
    }
    for (i = 0U; i < len; i++) {
        d |= b1[i] ^ b2[i];
    }
    return (bool) (1 & ((d - 1) >> 8));
}